

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

__pid_t __thiscall cs::process_context::fork(process_context *this)

{
  cs_exception_handler p_Var1;
  undefined *puVar2;
  process_context *this_00;
  size_t ss;
  unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> new_process;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this_00 = (process_context *)operator_new(0x110);
  ss = 100;
  if (999 < *(ulong *)(current_process + 0x78)) {
    ss = *(ulong *)(current_process + 0x78) / 10;
  }
  process_context(this_00,ss);
  this_00->output_precision = *(int *)(current_process + 0x50);
  std::__cxx11::string::_M_assign((string *)&this_00->import_path);
  puVar2 = current_process;
  local_38._8_8_ = 0;
  local_38._M_unused._M_function_pointer = (_func_void *)current_process;
  pcStack_20 = std::
               _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:165:45)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:165:45)>
             ::_M_manager;
  stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
            ((stack_type<std::function<bool(void*)>,std::allocator> *)&this_00->on_process_exit,
             (function<bool_(void_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_58._8_8_ = 0;
  local_58._M_unused._M_function_pointer = (_func_void *)puVar2;
  pcStack_40 = std::
               _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:168:47)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:168:47)>
             ::_M_manager;
  stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
            ((stack_type<std::function<bool(void*)>,std::allocator> *)&this_00->on_process_sigint,
             (function<bool_(void_*)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  p_Var1 = *(cs_exception_handler *)(current_process + 0x100);
  this_00->std_eh_callback = *(std_exception_handler *)(current_process + 0xf8);
  this_00->cs_eh_callback = p_Var1;
  *(process_context **)this = this_00;
  return (__pid_t)this;
}

Assistant:

std::unique_ptr<process_context> process_context::fork()
	{
		std::unique_ptr<process_context> new_process(new process_context(current_process->child_stack_size()));
		new_process->output_precision = current_process->output_precision;
		new_process->import_path = current_process->import_path;
		process_context *curr = current_process;
		new_process->on_process_exit.add_listener([curr](void *data) -> bool {
			return curr->on_process_exit.touch(data);
		});
		new_process->on_process_sigint.add_listener([curr](void *data) -> bool {
			return curr->on_process_sigint.touch(data);
		});
		new_process->std_eh_callback = current_process->std_eh_callback;
		new_process->cs_eh_callback = current_process->cs_eh_callback;
		return std::move(new_process);
	}